

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXCount.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *__s1;
  size_t sVar6;
  SAXParser *this;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  XMLSize_t XVar10;
  MemoryManager *pMVar11;
  DTDHandler *local_748;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  unsigned_long endMillis;
  unsigned_long startMillis;
  char fURI [1000];
  char local_308 [8];
  ifstream fin;
  unsigned_long duration;
  SAXCountHandlers handler;
  SAXParser *parser;
  XMLException *toCatch;
  char *parm;
  char local_78 [4];
  int argInd;
  char localeStr [64];
  bool recognizeNEL;
  bool errorOccurred;
  bool doList;
  bool schemaFullChecking;
  bool doSchema;
  bool doNamespaces;
  ValSchemes valScheme;
  char *xmlFile;
  char **argV_local;
  int argC_local;
  
  if (argC < 2) {
    usage();
    argV_local._4_4_ = 1;
  }
  else {
    bVar1 = false;
    bVar2 = false;
    bVar4 = false;
    memset(local_78,0,0x40);
    parm._4_4_ = 1;
    while ((parm._4_4_ < argC && (*argV[parm._4_4_] == '-'))) {
      iVar5 = strcmp(argV[parm._4_4_],"-?");
      if (iVar5 == 0) {
        usage();
        return 2;
      }
      iVar5 = strncmp(argV[parm._4_4_],"-v=",3);
      if ((iVar5 == 0) || (iVar5 = strncmp(argV[parm._4_4_],"-V=",3), iVar5 == 0)) {
        __s1 = argV[parm._4_4_] + 3;
        iVar5 = strcmp(__s1,"never");
        if ((iVar5 != 0) &&
           ((iVar5 = strcmp(__s1,"auto"), iVar5 != 0 && (iVar5 = strcmp(__s1,"always"), iVar5 != 0))
           )) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
          poVar7 = std::operator<<(poVar7,__s1);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          return 2;
        }
      }
      else {
        iVar5 = strcmp(argV[parm._4_4_],"-n");
        if (((((iVar5 != 0) && (iVar5 = strcmp(argV[parm._4_4_],"-N"), iVar5 != 0)) &&
             (iVar5 = strcmp(argV[parm._4_4_],"-s"), iVar5 != 0)) &&
            ((iVar5 = strcmp(argV[parm._4_4_],"-S"), iVar5 != 0 &&
             (iVar5 = strcmp(argV[parm._4_4_],"-f"), iVar5 != 0)))) &&
           (iVar5 = strcmp(argV[parm._4_4_],"-F"), iVar5 != 0)) {
          iVar5 = strcmp(argV[parm._4_4_],"-l");
          if ((iVar5 == 0) || (iVar5 = strcmp(argV[parm._4_4_],"-L"), iVar5 == 0)) {
            bVar1 = true;
          }
          else {
            iVar5 = strcmp(argV[parm._4_4_],"-special:nel");
            if (iVar5 == 0) {
              bVar4 = true;
            }
            else {
              iVar5 = strncmp(argV[parm._4_4_],"-locale=",8);
              if (iVar5 == 0) {
                strcpy(local_78,argV[parm._4_4_] + 8);
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
                poVar7 = std::operator<<(poVar7,argV[parm._4_4_]);
                poVar7 = std::operator<<(poVar7,"\', ignoring it\n");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
            }
          }
        }
      }
      parm._4_4_ = parm._4_4_ + 1;
    }
    if (parm._4_4_ == argC) {
      usage();
      argV_local._4_4_ = 1;
    }
    else {
      sVar6 = strlen(local_78);
      if (sVar6 == 0) {
        pMVar11 = (MemoryManager *)0x0;
        xercesc_4_0::XMLPlatformUtils::Initialize
                  ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,
                   (PanicHandler *)0x0,(MemoryManager *)0x0);
      }
      else {
        pMVar11 = (MemoryManager *)0x0;
        xercesc_4_0::XMLPlatformUtils::Initialize
                  (local_78,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
      }
      if (bVar4 != false) {
        pMVar11 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
        xercesc_4_0::XMLPlatformUtils::recognizeNEL
                  (bVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pMVar11);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      handler._64_8_ = this;
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      xercesc_4_0::SAXParser::setDoNamespaces(handler.fSawErrors);
      xercesc_4_0::SAXParser::setDoSchema(handler.fSawErrors);
      xercesc_4_0::SAXParser::setHandleMultipleImports(handler.fSawErrors);
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(handler.fSawErrors);
      SAXCountHandlers::SAXCountHandlers((SAXCountHandlers *)&duration);
      local_748 = (DTDHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0xf8) {
        local_748 = &handler.super_HandlerBase.super_DTDHandler;
      }
      (**(code **)(*(long *)handler._64_8_ + 0x20))(handler._64_8_,local_748);
      (**(code **)(*(long *)handler._64_8_ + 0x28))();
      std::ifstream::ifstream(local_308);
      if (bVar1) {
        std::ifstream::open(local_308,argV[parm._4_4_],8);
      }
      bVar3 = std::ios::fail();
      if ((bVar3 & 1) == 0) {
LAB_00105c17:
        memset(&startMillis,0,1000);
        if (bVar1) {
          bVar3 = std::ios::eof();
          if ((bVar3 & 1) == 0) goto LAB_00105c66;
        }
        else if (parm._4_4_ < argC) {
          _doList = (unsigned_long *)argV[parm._4_4_];
          parm._4_4_ = parm._4_4_ + 1;
          goto LAB_00105d15;
        }
        if (bVar1) {
          std::ifstream::close();
        }
        if (handler._64_8_ != 0) {
          (**(code **)(*(long *)handler._64_8_ + 8))();
        }
        xercesc_4_0::XMLPlatformUtils::Terminate();
        if (bVar2) {
          argV_local._4_4_ = 4;
        }
        else {
          argV_local._4_4_ = 0;
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
        poVar7 = std::operator<<(poVar7,argV[parm._4_4_]);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        argV_local._4_4_ = 2;
      }
      fURI[0x3e4] = '\x01';
      fURI[0x3e5] = '\0';
      fURI[0x3e6] = '\0';
      fURI[999] = '\0';
      std::ifstream::~ifstream(local_308);
      SAXCountHandlers::~SAXCountHandlers((SAXCountHandlers *)&duration);
    }
  }
  return argV_local._4_4_;
LAB_00105c66:
  std::istream::getline(local_308,(long)&startMillis);
  if ((char)startMillis != '\0') {
    _doList = &startMillis;
    poVar7 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    poVar7 = std::operator<<(poVar7,(char *)_doList);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
LAB_00105d15:
    SAXCountHandlers::resetErrors((SAXCountHandlers *)&duration);
    lVar8 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (**(code **)(*(long *)handler._64_8_ + 0x40))();
    lVar9 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    bVar4 = SAXCountHandlers::getSawErrors((SAXCountHandlers *)&duration);
    if (bVar4) {
      bVar2 = true;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,(char *)_doList);
      poVar7 = std::operator<<(poVar7,": ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,lVar9 - lVar8);
      poVar7 = std::operator<<(poVar7," ms (");
      XVar10 = SAXCountHandlers::getElementCount((SAXCountHandlers *)&duration);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,XVar10);
      poVar7 = std::operator<<(poVar7," elems, ");
      XVar10 = SAXCountHandlers::getAttrCount((SAXCountHandlers *)&duration);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,XVar10);
      poVar7 = std::operator<<(poVar7," attrs, ");
      XVar10 = SAXCountHandlers::getSpaceCount((SAXCountHandlers *)&duration);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,XVar10);
      poVar7 = std::operator<<(poVar7," spaces, ");
      XVar10 = SAXCountHandlers::getCharacterCount((SAXCountHandlers *)&duration);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,XVar10);
      poVar7 = std::operator<<(poVar7," chars)");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  goto LAB_00105c17;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    const char*              xmlFile = 0;
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool                     doNamespaces       = false;
    bool                     doSchema           = false;
    bool                     schemaFullChecking = false;
    bool                     doList = false;
    bool                     errorOccurred = false;
    bool                     recognizeNEL = false;
    char                     localeStr[64];
    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }
    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler.
    //
    SAXCountHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);


    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        //reset error count first
        handler.resetErrors();

        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(xmlFile);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorOccurred = true;
            continue;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
            errorOccurred = true;
            continue;
        }

        catch (...)
        {
            std::cerr << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
            errorOccurred = true;
            continue;
        }


        // Print out the stats that we collected and time taken
        if (!handler.getSawErrors())
        {
            std::cout << xmlFile << ": " << duration << " ms ("
                << handler.getElementCount() << " elems, "
                << handler.getAttrCount() << " attrs, "
                << handler.getSpaceCount() << " spaces, "
                << handler.getCharacterCount() << " chars)" << std::endl;
        }
        else
            errorOccurred = true;
    }

    if (doList)
        fin.close();

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}